

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall
sznet::net::TcpConnection::TcpConnection
          (TcpConnection *this,EventLoop *loop,string *nameArg,uint32_t id,sz_sock sockfd,
          InetAddress *localAddr,InetAddress *peerAddr)

{
  pointer pcVar1;
  ulong __n;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  sz_sock sVar6;
  EventLoop *pEVar7;
  Socket *pSVar8;
  Channel *pCVar9;
  Timestamp TVar10;
  LogStream *this_00;
  char **ppcVar11;
  int iVar12;
  undefined1 auVar14 [24];
  undefined1 auVar13 [64];
  SourceFile file;
  SourceFile file_00;
  Logger local_10a8;
  _Any_data local_d8;
  code *pcStack_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *pcStack_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *pcStack_88;
  code *pcStack_80;
  _Any_data local_78;
  code *pcStack_68;
  code *pcStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  unique_ptr<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_> *local_50;
  string *local_48;
  unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_> *local_40;
  sz_sock local_34;
  
  (this->super_enable_shared_from_this<sznet::net::TcpConnection>)._M_weak_this.
  super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<sznet::net::TcpConnection>)._M_weak_this.
  super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  file._8_8_ = 0x1f;
  file.m_data = (char *)0x11;
  local_34 = sockfd;
  pEVar7 = CheckNotNull<sznet::net::EventLoop>
                     ((sznet *)0x12c41a,file,0x12b9c4,(char *)loop,(EventLoop *)localAddr);
  this->m_loop = pEVar7;
  local_48 = &this->m_name;
  local_58 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_58;
  pcVar1 = (nameArg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + nameArg->_M_string_length);
  this->m_id = id;
  this->m_state = kConnecting;
  this->m_reading = true;
  pSVar8 = (Socket *)operator_new(8);
  sVar6 = local_34;
  local_50 = &this->m_socket;
  pSVar8->m_sockfd = local_34;
  pSVar8->m_ableClose = true;
  (this->m_socket)._M_t.
  super___uniq_ptr_impl<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>._M_t.
  super__Tuple_impl<0UL,_sznet::net::Socket_*,_std::default_delete<sznet::net::Socket>_>.
  super__Head_base<0UL,_sznet::net::Socket_*,_false>._M_head_impl = pSVar8;
  pCVar9 = (Channel *)operator_new(0xb8);
  Channel::Channel(pCVar9,loop,sVar6);
  local_40 = &this->m_channel;
  (this->m_channel)._M_t.
  super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>._M_t.
  super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
  super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl = pCVar9;
  uVar3 = *(undefined8 *)((long)&localAddr->field_0 + 8);
  uVar4 = *(undefined8 *)((long)&localAddr->field_0 + 0xc);
  uVar5 = *(undefined8 *)((long)&localAddr->field_0 + 0x14);
  *(undefined8 *)&(this->m_localAddr).field_0 = *(undefined8 *)&localAddr->field_0;
  *(undefined8 *)((long)&(this->m_localAddr).field_0 + 8) = uVar3;
  *(undefined8 *)((long)&(this->m_localAddr).field_0 + 0xc) = uVar4;
  *(undefined8 *)((long)&(this->m_localAddr).field_0 + 0x14) = uVar5;
  uVar3 = *(undefined8 *)((long)&peerAddr->field_0 + 8);
  uVar4 = *(undefined8 *)((long)&peerAddr->field_0 + 0xc);
  uVar5 = *(undefined8 *)((long)&peerAddr->field_0 + 0x14);
  *(undefined8 *)&(this->m_peerAddr).field_0 = *(undefined8 *)&peerAddr->field_0;
  *(undefined8 *)((long)&(this->m_peerAddr).field_0 + 8) = uVar3;
  *(undefined8 *)((long)&(this->m_peerAddr).field_0 + 0xc) = uVar4;
  *(undefined8 *)((long)&(this->m_peerAddr).field_0 + 0x14) = uVar5;
  auVar13 = ZEXT864(0) << 0x20;
  auVar14 = SUB3224(auVar13._0_32_,0);
  (this->m_connectionCallback).super__Function_base._M_functor = (_Any_data)auVar14._0_16_;
  (this->m_connectionCallback).super__Function_base._M_manager = (_Manager_type)auVar14._16_8_;
  (this->m_connectionCallback)._M_invoker = (_Invoker_type)SUB328(auVar13._0_32_,0x18);
  auVar14 = SUB3224(auVar13._32_32_,0);
  (this->m_messageCallback).super__Function_base._M_functor = (_Any_data)auVar14._0_16_;
  (this->m_messageCallback).super__Function_base._M_manager = (_Manager_type)auVar14._16_8_;
  (this->m_messageCallback)._M_invoker = (_Invoker_type)SUB328(auVar13._32_32_,0x18);
  auVar14 = SUB3224(auVar13._0_32_,0);
  (this->m_writeCompleteCallback).super__Function_base._M_functor = (_Any_data)auVar14._0_16_;
  (this->m_writeCompleteCallback).super__Function_base._M_manager = (_Manager_type)auVar14._16_8_;
  (this->m_writeCompleteCallback)._M_invoker = (_Invoker_type)SUB328(auVar13._0_32_,0x18);
  auVar14 = SUB3224(auVar13._32_32_,0);
  (this->m_highWaterMarkCallback).super__Function_base._M_functor = (_Any_data)auVar14._0_16_;
  (this->m_highWaterMarkCallback).super__Function_base._M_manager = (_Manager_type)auVar14._16_8_;
  (this->m_highWaterMarkCallback)._M_invoker = (_Invoker_type)SUB328(auVar13._32_32_,0x18);
  auVar14 = SUB3224(auVar13._0_32_,0);
  (this->m_highWaterMarkCallback).super__Function_base._M_functor = (_Any_data)auVar14._0_16_;
  (this->m_highWaterMarkCallback).super__Function_base._M_manager = (_Manager_type)auVar14._16_8_;
  (this->m_highWaterMarkCallback)._M_invoker = (_Invoker_type)SUB328(auVar13._0_32_,0x18);
  auVar14 = SUB3224(auVar13._32_32_,0);
  (this->m_closeCallback).super__Function_base._M_functor = (_Any_data)auVar14._0_16_;
  (this->m_closeCallback).super__Function_base._M_manager = (_Manager_type)auVar14._16_8_;
  (this->m_closeCallback)._M_invoker = (_Invoker_type)SUB328(auVar13._32_32_,0x18);
  this->m_highWaterMark = 0x4000000;
  Buffer::Buffer(&this->m_inputBuffer,4,0x400);
  Buffer::Buffer(&this->m_outputBuffer,4,0x400);
  (this->m_netStatInfo).m_recvBytes = 0;
  (this->m_netStatInfo).m_sendBytes = 0;
  (this->m_prevNetStatInfo).m_recvBytes = 0;
  (this->m_prevNetStatInfo).m_sendBytes = 0;
  TVar10 = Timestamp::now();
  (this->m_calcNetLastTime).m_microSecondsSinceEpoch = TVar10.m_microSecondsSinceEpoch;
  pCVar9 = (this->m_channel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  pcStack_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_d8._M_unused._0_8_ = handleRead;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = 0;
  *(TcpConnection **)((long)local_d8._M_unused._0_8_ + 0x10) = this;
  pcStack_c0 = std::
               _Function_handler<void_(sznet::Timestamp),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::_Placeholder<1>))(sznet::Timestamp)>_>
               ::_M_invoke;
  pcStack_c8 = std::
               _Function_handler<void_(sznet::Timestamp),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::_Placeholder<1>))(sznet::Timestamp)>_>
               ::_M_manager;
  std::function<void_(sznet::Timestamp)>::operator=
            (&pCVar9->m_readCallback,(function<void_(sznet::Timestamp)> *)&local_d8);
  if (pcStack_c8 != (code *)0x0) {
    (*pcStack_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  pCVar9 = (local_40->_M_t).
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  pcStack_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_b8._M_unused._0_8_ = handleWrite;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = 0;
  *(TcpConnection **)((long)local_b8._M_unused._0_8_ + 0x10) = this;
  pcStack_a0 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*))()>_>
               ::_M_invoke;
  pcStack_a8 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*))()>_>
               ::_M_manager;
  std::function<void_()>::operator=(&pCVar9->m_writeCallback,(function<void_()> *)&local_b8);
  if (pcStack_a8 != (code *)0x0) {
    (*pcStack_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  pCVar9 = (local_40->_M_t).
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  pcStack_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = operator_new(0x18);
  *(code **)local_98._M_unused._0_8_ = handleClose;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = 0;
  *(TcpConnection **)((long)local_98._M_unused._0_8_ + 0x10) = this;
  pcStack_80 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*))()>_>
               ::_M_invoke;
  pcStack_88 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*))()>_>
               ::_M_manager;
  std::function<void_()>::operator=(&pCVar9->m_closeCallback,(function<void_()> *)&local_98);
  if (pcStack_88 != (code *)0x0) {
    (*pcStack_88)(&local_98,&local_98,__destroy_functor);
  }
  pCVar9 = (local_40->_M_t).
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  pcStack_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(code **)local_78._M_unused._0_8_ = handleError;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(TcpConnection **)((long)local_78._M_unused._0_8_ + 0x10) = this;
  pcStack_60 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*))()>_>
               ::_M_invoke;
  pcStack_68 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*))()>_>
               ::_M_manager;
  std::function<void_()>::operator=(&pCVar9->m_errorCallback,(function<void_()> *)&local_78);
  if (pcStack_68 != (code *)0x0) {
    (*pcStack_68)(&local_78,&local_78,__destroy_functor);
  }
  sVar6 = local_34;
  if (g_logLevel < 2) {
    file_00._8_8_ = 0x11;
    file_00.m_data = "TcpConnection.cpp";
    Logger::Logger(&local_10a8,file_00,0x33,DEBUG,"TcpConnection");
    iVar12 = (int)&local_10a8 + 0xfb0;
    if (0x14 < (uint)(iVar12 - (int)local_10a8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_10a8.m_impl.m_stream.m_buffer.m_cur,"TcpConnection::ctor[",0x14);
      local_10a8.m_impl.m_stream.m_buffer.m_cur = local_10a8.m_impl.m_stream.m_buffer.m_cur + 0x14;
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(iVar12 - (int)local_10a8.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_10a8.m_impl.m_stream.m_buffer.m_cur,(local_48->_M_dataplus)._M_p,__n);
      local_10a8.m_impl.m_stream.m_buffer.m_cur = local_10a8.m_impl.m_stream.m_buffer.m_cur + __n;
    }
    if (5 < (uint)(iVar12 - (int)local_10a8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_10a8.m_impl.m_stream.m_buffer.m_cur,"] at ",5);
      local_10a8.m_impl.m_stream.m_buffer.m_cur = local_10a8.m_impl.m_stream.m_buffer.m_cur + 5;
    }
    this_00 = LogStream::operator<<(&local_10a8.m_impl.m_stream,this);
    ppcVar11 = &(this_00->m_buffer).m_cur;
    pcVar2 = (this_00->m_buffer).m_cur;
    if (4 < (uint)((int)ppcVar11 - (int)pcVar2)) {
      builtin_strncpy(pcVar2," fd=",4);
      *ppcVar11 = *ppcVar11 + 4;
    }
    LogStream::operator<<(this_00,sVar6);
    Logger::~Logger(&local_10a8);
  }
  Socket::setKeepAlive
            ((local_50->_M_t).
             super___uniq_ptr_impl<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>.
             _M_t.
             super__Tuple_impl<0UL,_sznet::net::Socket_*,_std::default_delete<sznet::net::Socket>_>.
             super__Head_base<0UL,_sznet::net::Socket_*,_false>._M_head_impl,true);
  return;
}

Assistant:

TcpConnection::TcpConnection(EventLoop* loop, const string& nameArg, const uint32_t id, sockets::sz_sock sockfd, const InetAddress& localAddr, const InetAddress& peerAddr): 
	m_loop(CHECK_NOTNULL(loop)),
	m_name(nameArg),
	m_id(id),
	m_state(kConnecting),
	m_reading(true),
	m_socket(new Socket(sockfd)),
	m_channel(new Channel(loop, sockfd)),
	m_localAddr(localAddr),
	m_peerAddr(peerAddr),
	m_highWaterMark(64 * 1024 * 1024),
	m_calcNetLastTime(Timestamp::now())
{
	// ���ÿɶ�
	m_channel->setReadCallback(std::bind(&TcpConnection::handleRead, this, std::placeholders::_1));
	// ���ÿ�д
	m_channel->setWriteCallback(std::bind(&TcpConnection::handleWrite, this));
	// ���ùر�
	m_channel->setCloseCallback(std::bind(&TcpConnection::handleClose, this));
	// ���ô���
	m_channel->setErrorCallback(std::bind(&TcpConnection::handleError, this));
	LOG_DEBUG << "TcpConnection::ctor[" << m_name << "] at " << this << " fd=" << sockfd;
	// ��������
	m_socket->setKeepAlive(true);
}